

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect_jobserver.c
# Opt level: O0

int posix(char *jobserver,char *message)

{
  int iVar1;
  char *__file;
  char *path;
  int write_fd;
  int read_fd;
  char *message_local;
  char *jobserver_local;
  
  _write_fd = message;
  message_local = jobserver;
  iVar1 = __isoc99_sscanf(jobserver,"%d,%d",(long)&path + 4,&path);
  if (iVar1 == 2) {
    jobserver_local._4_4_ = test_fd(path._4_4_,(int)path,_write_fd);
  }
  else {
    iVar1 = strncmp(message_local,"fifo:",5);
    if (iVar1 == 0) {
      __file = message_local + 5;
      path._4_4_ = open(__file,0);
      path._0_4_ = open(__file,1);
      jobserver_local._4_4_ = test_fd(path._4_4_,(int)path,_write_fd);
    }
    else {
      snprintf(_write_fd,0x3ff,"Unrecognized jobserver format: %s\n",message_local);
      jobserver_local._4_4_ = 1;
    }
  }
  return jobserver_local._4_4_;
}

Assistant:

int posix(const char* jobserver, char* message)
{
  int read_fd;
  int write_fd;

  // First try to parse as "R,W" file descriptors
  if (sscanf(jobserver, "%d,%d", &read_fd, &write_fd) == 2) {
    return test_fd(read_fd, write_fd, message);
  }

  // Then try to parse as "fifo:PATH"
  if (strncmp(jobserver, "fifo:", 5) == 0) {
    const char* path = jobserver + 5;
    read_fd = open(path, O_RDONLY);
    write_fd = open(path, O_WRONLY);
    return test_fd(read_fd, write_fd, message);
  }

  // We don't understand the format
  snprintf(message, MAX_MESSAGE_LENGTH, "Unrecognized jobserver format: %s\n",
           jobserver);
  return 1;
}